

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall smf::Options::getDefinition(Options *this,string *optionName)

{
  bool bVar1;
  pointer ppVar2;
  reference ppOVar3;
  string *psVar4;
  key_type *in_RDX;
  allocator local_31;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *optionName_local;
  Options *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)(optionName + 0x78),in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)(optionName + 0x78));
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_28);
    ppOVar3 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[]((vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_> *)
                         (optionName + 0x60),(long)ppVar2->second);
    psVar4 = Option_register::getDefinition_abi_cxx11_(*ppOVar3);
    std::__cxx11::string::string((string *)this,(string *)psVar4);
  }
  return this;
}

Assistant:

std::string Options::getDefinition(const std::string& optionName) {
   auto it = m_optionList.find(optionName);
   if (it == m_optionList.end()) {
      return "";
   } else {
      return m_optionRegister[it->second]->getDefinition();
   }
}